

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

visuals_color_cycle *
visuals_cycler_cycle_by_name(visuals_cycler *cycler,char *group_name,char *cycle_name)

{
  size_t sVar1;
  visuals_cycle_group *pvVar2;
  visuals_color_cycle *pvVar3;
  int iVar4;
  size_t sVar5;
  
  if (group_name != (char *)0x0) {
    if (cycle_name == (char *)0x0) {
      return (visuals_color_cycle *)0x0;
    }
    if (*group_name == '\0') {
      return (visuals_color_cycle *)0x0;
    }
    if (*cycle_name != '\0') {
      sVar1 = cycler->max_groups;
      sVar5 = 0;
      do {
        if (sVar1 == sVar5) {
          return (visuals_color_cycle *)0x0;
        }
        pvVar2 = cycler->groups[sVar5];
        iVar4 = strcmp(pvVar2->group_name,group_name);
        sVar5 = sVar5 + 1;
      } while (iVar4 != 0);
      sVar1 = pvVar2->max_cycles;
      sVar5 = 0;
      while (sVar1 != sVar5) {
        pvVar3 = pvVar2->cycles[sVar5];
        iVar4 = strcmp(pvVar3->cycle_name,cycle_name);
        sVar5 = sVar5 + 1;
        if (iVar4 == 0) {
          return pvVar3;
        }
      }
    }
  }
  return (visuals_color_cycle *)0x0;
}

Assistant:

static struct visuals_color_cycle *visuals_cycler_cycle_by_name(struct visuals_cycler const *cycler,
																const char *group_name,
																const char *cycle_name)
{
	struct visuals_cycle_group *group = NULL;
	struct visuals_color_cycle *cycle = NULL;
	size_t i = 0;

	if (group_name == NULL || strlen(group_name) == 0) {
		return NULL;
	}

	if (cycle_name == NULL || strlen(cycle_name) == 0) {
		return NULL;
	}

	for (i = 0; i < cycler->max_groups; i++) {
		if (streq(cycler->groups[i]->group_name, group_name)) {
			group = cycler->groups[i];
			break;
		}
	}

	if (group == NULL) {
		return NULL;
	}

	for (i = 0; i < group->max_cycles; i++) {
		if (streq(group->cycles[i]->cycle_name, cycle_name)) {
			cycle = group->cycles[i];
			break;
		}
	}

	return cycle;
}